

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O1

Expression *
slang::ast::Expression::bindAssignmentPattern
          (Compilation *comp,AssignmentPatternExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  SyntaxKind SVar1;
  SymbolKind SVar2;
  Type *this;
  SyntaxNode *this_00;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  bool bVar3;
  int iVar4;
  uint uVar5;
  Type *elementType;
  Diagnostic *diag;
  SimpleAssignmentPatternSyntax *pSVar7;
  Expression *pEVar8;
  StructuredAssignmentPatternSyntax *pSVar9;
  ReplicatedAssignmentPatternSyntax *pRVar10;
  Compilation *pCVar11;
  logic_error *plVar12;
  long *plVar13;
  size_type *psVar14;
  long *plVar15;
  int iVar16;
  DiagCode code;
  FixedSizeUnpackedArrayType *ua;
  Type *structScope;
  SourceRange sourceRange_04;
  SourceLocation in_stack_fffffffffffffe58;
  SourceLocation local_1a0;
  long *local_198;
  long local_190;
  long local_188;
  long lStack_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  long *local_158;
  long local_150;
  long local_148;
  long lStack_140;
  SourceLocation local_138;
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  SourceRange local_d0;
  SourceRange local_c0;
  SourceRange local_b0;
  SourceRange local_a0;
  SourceRange local_90;
  SourceRange local_80;
  SourceRange local_70;
  SourceLocation local_60;
  SourceLocation SStack_58;
  SourceLocation local_50;
  SourceLocation SStack_48;
  SourceLocation local_40;
  SourceLocation SStack_38;
  SourceLocation SVar6;
  
  sourceRange_04 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  SVar6 = sourceRange_04.startLoc;
  if (syntax->type != (DataTypeSyntax *)0x0) {
    assignmentTarget = Compilation::getType(comp,syntax->type,context,(Type *)0x0);
    bVar3 = Type::isSimpleType(assignmentTarget);
    if ((bVar3) || ((syntax->type->super_ExpressionSyntax).super_SyntaxNode.kind == TypeReference))
    goto LAB_003915ef;
    if (assignmentTarget->canonical == (Type *)0x0) {
      Type::resolveCanonical(assignmentTarget);
    }
    if ((assignmentTarget->canonical->super_Symbol).kind == ErrorType) goto LAB_003916a6;
LAB_00391693:
    diag = ASTContext::addDiag(context,(DiagCode)0x1c0007,sourceRange_04);
    ast::operator<<(diag,assignmentTarget);
    goto LAB_003916a6;
  }
LAB_003915ef:
  if (assignmentTarget == (Type *)0x0) {
    sourceRange_04 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    code.subsystem = Expressions;
    code.code = 0x14;
    goto LAB_00391669;
  }
  if (assignmentTarget->canonical == (Type *)0x0) {
    Type::resolveCanonical(assignmentTarget);
  }
  if ((assignmentTarget->canonical->super_Symbol).kind == ErrorType) goto LAB_003916a6;
  this = assignmentTarget->canonical;
  local_138 = sourceRange_04.endLoc;
  switch((this->super_Symbol).kind) {
  case PackedArrayType:
    elementType = (Type *)this[1].super_Symbol.name._M_len;
    iVar16 = *(int *)&this[1].super_Symbol.name._M_str -
             *(int *)((long)&this[1].super_Symbol.name._M_str + 4);
    goto LAB_003916e1;
  case FixedSizeUnpackedArrayType:
    elementType = *(Type **)&this[1].super_Symbol;
    iVar16 = (int)this[1].super_Symbol.name._M_len -
             *(int *)((long)&this[1].super_Symbol.name._M_len + 4);
LAB_003916e1:
    iVar4 = -iVar16;
    if (0 < iVar16) {
      iVar4 = iVar16;
    }
    uVar5 = iVar4 + 1;
    break;
  case DynamicArrayType:
  case AssociativeArrayType:
  case QueueType:
    elementType = Type::getArrayElementType(this);
    sourceRange_04.endLoc = local_138;
    sourceRange_04.startLoc = SVar6;
    uVar5 = 0;
    break;
  case PackedStructType:
    structScope = (Type *)&this[1].super_Symbol.name;
    goto LAB_00391736;
  case UnpackedStructType:
    structScope = this + 1;
LAB_00391736:
    uVar5 = 0;
    elementType = (Type *)0x0;
    goto LAB_0039173a;
  default:
    bVar3 = Type::isIntegral(this);
    if ((!bVar3) || ((this->super_Symbol).kind == ScalarType)) goto LAB_00391693;
    bVar3 = Type::isFourState(this);
    elementType = comp->scalarTypeTable[(ulong)bVar3 + 8];
    uVar5 = Type::getBitWidth(this);
    sourceRange_04.endLoc = local_138;
    sourceRange_04.startLoc = SVar6;
  }
  structScope = (Type *)0x0;
LAB_0039173a:
  local_138 = sourceRange_04.endLoc;
  SVar6 = local_138;
  local_1a0 = sourceRange_04.startLoc;
  this_00 = &((syntax->pattern).ptr)->super_SyntaxNode;
  if (this_00 == (SyntaxNode *)0x0) {
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,
               "T slang::not_null<slang::syntax::AssignmentPatternSyntax *>::get() const [T = slang::syntax::AssignmentPatternSyntax *]"
              );
  }
  if (structScope == (Type *)0x0) {
    SVar2 = (this->super_Symbol).kind;
    if (SVar2 != QueueType) {
      if (SVar2 == AssociativeArrayType) {
        SVar1 = this_00->kind;
        if (SVar1 != ReplicatedAssignmentPattern) {
          if (SVar1 == StructuredAssignmentPattern) {
            pSVar9 = slang::syntax::SyntaxNode::as<slang::syntax::StructuredAssignmentPatternSyntax>
                               (this_00);
            local_a0 = sourceRange_04;
            pEVar8 = StructuredAssignmentPatternExpression::forAssociativeArray
                               (comp,pSVar9,context,assignmentTarget,elementType,sourceRange_04);
            return pEVar8;
          }
          if (SVar1 != SimpleAssignmentPattern) {
            plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
            local_130[0] = local_120;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_130,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                       ,"");
            plVar13 = (long *)std::__cxx11::string::append((char *)local_130);
            local_178._M_dataplus._M_p = (pointer)*plVar13;
            psVar14 = (size_type *)(plVar13 + 2);
            if ((size_type *)local_178._M_dataplus._M_p == psVar14) {
              local_178.field_2._M_allocated_capacity = *psVar14;
              local_178.field_2._8_8_ = plVar13[3];
              local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
            }
            else {
              local_178.field_2._M_allocated_capacity = *psVar14;
            }
            local_178._M_string_length = plVar13[1];
            *plVar13 = (long)psVar14;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            std::__cxx11::to_string(&local_110,0x479);
            std::operator+(&local_f0,&local_178,&local_110);
            plVar13 = (long *)std::__cxx11::string::append((char *)&local_f0);
            local_158 = (long *)*plVar13;
            plVar15 = plVar13 + 2;
            if (local_158 == plVar15) {
              local_148 = *plVar15;
              lStack_140 = plVar13[3];
              local_158 = &local_148;
            }
            else {
              local_148 = *plVar15;
            }
            local_150 = plVar13[1];
            *plVar13 = (long)plVar15;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            plVar13 = (long *)std::__cxx11::string::append((char *)&local_158);
            local_198 = (long *)*plVar13;
            plVar15 = plVar13 + 2;
            if (local_198 == plVar15) {
              local_188 = *plVar15;
              lStack_180 = plVar13[3];
              local_198 = &local_188;
            }
            else {
              local_188 = *plVar15;
            }
            local_190 = plVar13[1];
            *plVar13 = (long)plVar15;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            std::logic_error::logic_error(plVar12,(string *)&local_198);
            __cxa_throw(plVar12,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
        }
        code.subsystem = Expressions;
        code.code = 0xc;
LAB_00391669:
        ASTContext::addDiag(context,code,sourceRange_04);
LAB_003916a6:
        pEVar8 = badExpr(comp,(Expression *)0x0);
        return pEVar8;
      }
      if (SVar2 != DynamicArrayType) {
        SVar1 = this_00->kind;
        if (SVar1 == ReplicatedAssignmentPattern) {
          pCVar11 = (Compilation *)
                    slang::syntax::SyntaxNode::as<slang::syntax::ReplicatedAssignmentPatternSyntax>
                              (this_00);
          sourceRange_03.endLoc = in_stack_fffffffffffffe58;
          sourceRange_03.startLoc = SVar6;
          local_d0 = sourceRange_04;
          pEVar8 = ReplicatedAssignmentPatternExpression::forFixedArray
                             ((ReplicatedAssignmentPatternExpression *)comp,pCVar11,
                              (ReplicatedAssignmentPatternSyntax *)context,
                              (ASTContext *)assignmentTarget,elementType,(Type *)(ulong)uVar5,
                              sourceRange_04.startLoc._0_4_,sourceRange_03);
          return pEVar8;
        }
        if (SVar1 != StructuredAssignmentPattern) {
          if (SVar1 == SimpleAssignmentPattern) {
            pCVar11 = (Compilation *)
                      slang::syntax::SyntaxNode::as<slang::syntax::SimpleAssignmentPatternSyntax>
                                (this_00);
            sourceRange_02.endLoc = in_stack_fffffffffffffe58;
            sourceRange_02.startLoc = SVar6;
            local_b0 = sourceRange_04;
            pEVar8 = SimpleAssignmentPatternExpression::forFixedArray
                               ((SimpleAssignmentPatternExpression *)comp,pCVar11,
                                (SimpleAssignmentPatternSyntax *)context,
                                (ASTContext *)assignmentTarget,elementType,(Type *)(ulong)uVar5,
                                sourceRange_04.startLoc._0_4_,sourceRange_02);
            return pEVar8;
          }
          plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
          local_130[0] = local_120;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_130,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                     ,"");
          plVar13 = (long *)std::__cxx11::string::append((char *)local_130);
          local_178._M_dataplus._M_p = (pointer)*plVar13;
          psVar14 = (size_type *)(plVar13 + 2);
          if ((size_type *)local_178._M_dataplus._M_p == psVar14) {
            local_178.field_2._M_allocated_capacity = *psVar14;
            local_178.field_2._8_8_ = plVar13[3];
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
          }
          else {
            local_178.field_2._M_allocated_capacity = *psVar14;
          }
          local_178._M_string_length = plVar13[1];
          *plVar13 = (long)psVar14;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          std::__cxx11::to_string(&local_110,0x48b);
          std::operator+(&local_f0,&local_178,&local_110);
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_f0);
          local_158 = (long *)*plVar13;
          plVar15 = plVar13 + 2;
          if (local_158 == plVar15) {
            local_148 = *plVar15;
            lStack_140 = plVar13[3];
            local_158 = &local_148;
          }
          else {
            local_148 = *plVar15;
          }
          local_150 = plVar13[1];
          *plVar13 = (long)plVar15;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_158);
          local_198 = (long *)*plVar13;
          plVar15 = plVar13 + 2;
          if (local_198 == plVar15) {
            local_188 = *plVar15;
            lStack_180 = plVar13[3];
            local_198 = &local_188;
          }
          else {
            local_188 = *plVar15;
          }
          local_190 = plVar13[1];
          *plVar13 = (long)plVar15;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          std::logic_error::logic_error(plVar12,(string *)&local_198);
          __cxa_throw(plVar12,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        pSVar9 = slang::syntax::SyntaxNode::as<slang::syntax::StructuredAssignmentPatternSyntax>
                           (this_00);
        local_c0 = sourceRange_04;
        pEVar8 = StructuredAssignmentPatternExpression::forFixedArray
                           (comp,pSVar9,context,assignmentTarget,elementType,sourceRange_04);
        return pEVar8;
      }
    }
    SVar1 = this_00->kind;
    if (SVar1 == ReplicatedAssignmentPattern) {
      pRVar10 = slang::syntax::SyntaxNode::as<slang::syntax::ReplicatedAssignmentPatternSyntax>
                          (this_00);
      local_90 = sourceRange_04;
      pEVar8 = ReplicatedAssignmentPatternExpression::forDynamicArray
                         (comp,pRVar10,context,assignmentTarget,elementType,sourceRange_04);
    }
    else if (SVar1 == StructuredAssignmentPattern) {
      pSVar9 = slang::syntax::SyntaxNode::as<slang::syntax::StructuredAssignmentPatternSyntax>
                         (this_00);
      local_80 = sourceRange_04;
      pEVar8 = StructuredAssignmentPatternExpression::forDynamicArray
                         (comp,pSVar9,context,assignmentTarget,elementType,sourceRange_04);
    }
    else {
      if (SVar1 != SimpleAssignmentPattern) {
        plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
        local_130[0] = local_120;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_130,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                   ,"");
        plVar13 = (long *)std::__cxx11::string::append((char *)local_130);
        local_178._M_dataplus._M_p = (pointer)*plVar13;
        psVar14 = (size_type *)(plVar13 + 2);
        if ((size_type *)local_178._M_dataplus._M_p == psVar14) {
          local_178.field_2._M_allocated_capacity = *psVar14;
          local_178.field_2._8_8_ = plVar13[3];
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        }
        else {
          local_178.field_2._M_allocated_capacity = *psVar14;
        }
        local_178._M_string_length = plVar13[1];
        *plVar13 = (long)psVar14;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        std::__cxx11::to_string(&local_110,0x46b);
        std::operator+(&local_f0,&local_178,&local_110);
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_f0);
        local_158 = (long *)*plVar13;
        plVar15 = plVar13 + 2;
        if (local_158 == plVar15) {
          local_148 = *plVar15;
          lStack_140 = plVar13[3];
          local_158 = &local_148;
        }
        else {
          local_148 = *plVar15;
        }
        local_150 = plVar13[1];
        *plVar13 = (long)plVar15;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_158);
        local_198 = (long *)*plVar13;
        plVar15 = plVar13 + 2;
        if (local_198 == plVar15) {
          local_188 = *plVar15;
          lStack_180 = plVar13[3];
          local_198 = &local_188;
        }
        else {
          local_188 = *plVar15;
        }
        local_190 = plVar13[1];
        *plVar13 = (long)plVar15;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        std::logic_error::logic_error(plVar12,(string *)&local_198);
        __cxa_throw(plVar12,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      pSVar7 = slang::syntax::SyntaxNode::as<slang::syntax::SimpleAssignmentPatternSyntax>(this_00);
      local_70 = sourceRange_04;
      pEVar8 = SimpleAssignmentPatternExpression::forDynamicArray
                         (comp,pSVar7,context,assignmentTarget,elementType,sourceRange_04);
    }
  }
  else {
    SVar1 = this_00->kind;
    if (SVar1 == ReplicatedAssignmentPattern) {
      pRVar10 = slang::syntax::SyntaxNode::as<slang::syntax::ReplicatedAssignmentPatternSyntax>
                          (this_00);
      local_60 = local_1a0;
      SStack_58 = local_138;
      sourceRange_01.endLoc = local_138;
      sourceRange_01.startLoc = local_1a0;
      pEVar8 = ReplicatedAssignmentPatternExpression::forStruct
                         (comp,pRVar10,context,assignmentTarget,(Scope *)structScope,sourceRange_01)
      ;
    }
    else if (SVar1 == StructuredAssignmentPattern) {
      pSVar9 = slang::syntax::SyntaxNode::as<slang::syntax::StructuredAssignmentPatternSyntax>
                         (this_00);
      local_50 = local_1a0;
      SStack_48 = local_138;
      sourceRange_00.endLoc = local_138;
      sourceRange_00.startLoc = local_1a0;
      pEVar8 = StructuredAssignmentPatternExpression::forStruct
                         (comp,pSVar9,context,assignmentTarget,(Scope *)structScope,sourceRange_00);
    }
    else {
      if (SVar1 != SimpleAssignmentPattern) {
        plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
        local_130[0] = local_120;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_130,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                   ,"");
        plVar13 = (long *)std::__cxx11::string::append((char *)local_130);
        local_178._M_dataplus._M_p = (pointer)*plVar13;
        psVar14 = (size_type *)(plVar13 + 2);
        if ((size_type *)local_178._M_dataplus._M_p == psVar14) {
          local_178.field_2._M_allocated_capacity = *psVar14;
          local_178.field_2._8_8_ = plVar13[3];
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        }
        else {
          local_178.field_2._M_allocated_capacity = *psVar14;
        }
        local_178._M_string_length = plVar13[1];
        *plVar13 = (long)psVar14;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        std::__cxx11::to_string(&local_110,0x459);
        std::operator+(&local_f0,&local_178,&local_110);
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_f0);
        local_158 = (long *)*plVar13;
        plVar15 = plVar13 + 2;
        if (local_158 == plVar15) {
          local_148 = *plVar15;
          lStack_140 = plVar13[3];
          local_158 = &local_148;
        }
        else {
          local_148 = *plVar15;
        }
        local_150 = plVar13[1];
        *plVar13 = (long)plVar15;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_158);
        local_198 = (long *)*plVar13;
        plVar15 = plVar13 + 2;
        if (local_198 == plVar15) {
          local_188 = *plVar15;
          lStack_180 = plVar13[3];
          local_198 = &local_188;
        }
        else {
          local_188 = *plVar15;
        }
        local_190 = plVar13[1];
        *plVar13 = (long)plVar15;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        std::logic_error::logic_error(plVar12,(string *)&local_198);
        __cxa_throw(plVar12,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      pSVar7 = slang::syntax::SyntaxNode::as<slang::syntax::SimpleAssignmentPatternSyntax>(this_00);
      local_40 = local_1a0;
      SStack_38 = local_138;
      sourceRange.endLoc = local_138;
      sourceRange.startLoc = local_1a0;
      pEVar8 = SimpleAssignmentPatternExpression::forStruct
                         (comp,pSVar7,context,assignmentTarget,(Scope *)structScope,sourceRange);
    }
  }
  return pEVar8;
}

Assistant:

Expression& Expression::bindAssignmentPattern(Compilation& comp,
                                              const AssignmentPatternExpressionSyntax& syntax,
                                              const ASTContext& context,
                                              const Type* assignmentTarget) {
    SourceRange range = syntax.sourceRange();

    if (syntax.type) {
        assignmentTarget = &comp.getType(*syntax.type, context);
        if (!assignmentTarget->isSimpleType() && syntax.type->kind != SyntaxKind::TypeReference) {
            if (!assignmentTarget->isError())
                context.addDiag(diag::BadAssignmentPatternType, range) << *assignmentTarget;
            return badExpr(comp, nullptr);
        }
    }

    if (!assignmentTarget || assignmentTarget->isError()) {
        if (!assignmentTarget)
            context.addDiag(diag::AssignmentPatternNoContext, syntax.sourceRange());
        return badExpr(comp, nullptr);
    }

    const Type& type = *assignmentTarget;
    const Scope* structScope = nullptr;
    const Type* elementType = nullptr;
    bitwidth_t numElements = 0;

    auto& ct = type.getCanonicalType();
    if (ct.kind == SymbolKind::PackedStructType) {
        structScope = &ct.as<PackedStructType>();
    }
    else if (ct.kind == SymbolKind::UnpackedStructType) {
        structScope = &ct.as<UnpackedStructType>();
    }
    else if (ct.kind == SymbolKind::PackedArrayType) {
        auto& ua = ct.as<PackedArrayType>();
        elementType = &ua.elementType;
        numElements = ua.range.width();
    }
    else if (ct.kind == SymbolKind::FixedSizeUnpackedArrayType) {
        auto& ua = ct.as<FixedSizeUnpackedArrayType>();
        elementType = &ua.elementType;
        numElements = ua.range.width();
    }
    else if (ct.kind == SymbolKind::DynamicArrayType ||
             ct.kind == SymbolKind::AssociativeArrayType || ct.kind == SymbolKind::QueueType) {
        elementType = ct.getArrayElementType();
    }
    else if (ct.isIntegral() && ct.kind != SymbolKind::ScalarType) {
        elementType = ct.isFourState() ? &comp.getLogicType() : &comp.getBitType();
        numElements = ct.getBitWidth();
    }
    else {
        context.addDiag(diag::BadAssignmentPatternType, range) << type;
        return badExpr(comp, nullptr);
    }

    const AssignmentPatternSyntax& p = *syntax.pattern;
    if (structScope) {
        switch (p.kind) {
            case SyntaxKind::SimpleAssignmentPattern:
                return SimpleAssignmentPatternExpression::forStruct(
                    comp, p.as<SimpleAssignmentPatternSyntax>(), context, type, *structScope,
                    range);
            case SyntaxKind::StructuredAssignmentPattern:
                return StructuredAssignmentPatternExpression::forStruct(
                    comp, p.as<StructuredAssignmentPatternSyntax>(), context, type, *structScope,
                    range);
            case SyntaxKind::ReplicatedAssignmentPattern:
                return ReplicatedAssignmentPatternExpression::forStruct(
                    comp, p.as<ReplicatedAssignmentPatternSyntax>(), context, type, *structScope,
                    range);
            default:
                ASSUME_UNREACHABLE;
        }
    }
    else if (ct.kind == SymbolKind::DynamicArrayType || ct.kind == SymbolKind::QueueType) {
        switch (p.kind) {
            case SyntaxKind::SimpleAssignmentPattern:
                return SimpleAssignmentPatternExpression::forDynamicArray(
                    comp, p.as<SimpleAssignmentPatternSyntax>(), context, type, *elementType,
                    range);
            case SyntaxKind::StructuredAssignmentPattern:
                return StructuredAssignmentPatternExpression::forDynamicArray(
                    comp, p.as<StructuredAssignmentPatternSyntax>(), context, type, *elementType,
                    range);
            case SyntaxKind::ReplicatedAssignmentPattern:
                return ReplicatedAssignmentPatternExpression::forDynamicArray(
                    comp, p.as<ReplicatedAssignmentPatternSyntax>(), context, type, *elementType,
                    range);
            default:
                ASSUME_UNREACHABLE;
        }
    }
    else if (ct.kind == SymbolKind::AssociativeArrayType) {
        switch (p.kind) {
            case SyntaxKind::SimpleAssignmentPattern:
            case SyntaxKind::ReplicatedAssignmentPattern:
                context.addDiag(diag::AssignmentPatternAssociativeType, range);
                return badExpr(comp, nullptr);
            case SyntaxKind::StructuredAssignmentPattern:
                return StructuredAssignmentPatternExpression::forAssociativeArray(
                    comp, p.as<StructuredAssignmentPatternSyntax>(), context, type, *elementType,
                    range);
            default:
                ASSUME_UNREACHABLE;
        }
    }
    else {
        switch (p.kind) {
            case SyntaxKind::SimpleAssignmentPattern:
                return SimpleAssignmentPatternExpression::forFixedArray(
                    comp, p.as<SimpleAssignmentPatternSyntax>(), context, type, *elementType,
                    numElements, range);
            case SyntaxKind::StructuredAssignmentPattern:
                return StructuredAssignmentPatternExpression::forFixedArray(
                    comp, p.as<StructuredAssignmentPatternSyntax>(), context, type, *elementType,
                    range);
            case SyntaxKind::ReplicatedAssignmentPattern:
                return ReplicatedAssignmentPatternExpression::forFixedArray(
                    comp, p.as<ReplicatedAssignmentPatternSyntax>(), context, type, *elementType,
                    numElements, range);
            default:
                ASSUME_UNREACHABLE;
        }
    }
}